

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::MatrixAccumulator::MatrixAccumulator(MatrixAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  (this->super_BaseAccumulator)._vptr_BaseAccumulator = (_func_int **)&PTR_clear_002bfe30;
  SquareMatrix<double,_3>::SquareMatrix(&(this->Val_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Avg_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Avg2_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Total_).super_SquareMatrix<double,_3>);
  (**(this->super_BaseAccumulator)._vptr_BaseAccumulator)(this);
  return;
}

Assistant:

MatrixAccumulator() : BaseAccumulator() { this->clear(); }